

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O1

void opj_dwt_encode_1(OPJ_INT32 *a,OPJ_INT32 dn,OPJ_INT32 sn,OPJ_INT32 cas)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  if (cas == 0) {
    if (0 < dn || 1 < sn) {
      if (0 < dn) {
        lVar3 = (long)(sn * 2 + -2);
        lVar5 = 2;
        uVar8 = 0;
        do {
          lVar6 = lVar5 + -2;
          if ((long)sn <= (long)uVar8) {
            lVar6 = lVar3;
          }
          uVar1 = uVar8 + 1;
          lVar7 = lVar3;
          if ((long)uVar1 < (long)sn) {
            lVar7 = lVar5;
          }
          a[uVar8 * 2 + 1] = a[uVar8 * 2 + 1] - (a[lVar7] + a[lVar6] >> 1);
          lVar5 = lVar5 + 2;
          uVar8 = uVar1;
        } while ((uint)dn != uVar1);
      }
      if (0 < sn) {
        uVar2 = 0xffffffff;
        lVar3 = (long)(dn * 2 + -1);
        lVar5 = 1;
        uVar8 = 0;
        do {
          piVar4 = a + 1;
          if ((uVar8 != 0) && (piVar4 = a + lVar3, (long)uVar8 <= (long)dn)) {
            piVar4 = a + uVar2;
          }
          lVar6 = lVar3;
          if ((long)uVar8 < (long)dn) {
            lVar6 = lVar5;
          }
          a[uVar8 * 2] = a[uVar8 * 2] + (*piVar4 + a[lVar6] + 2 >> 2);
          uVar8 = uVar8 + 1;
          uVar2 = uVar2 + 2;
          lVar5 = lVar5 + 2;
        } while ((uint)sn != uVar8);
      }
    }
  }
  else if (dn == 1 && sn == 0) {
    *a = *a << 1;
  }
  else {
    if (0 < dn) {
      uVar2 = 0xffffffff;
      lVar3 = (long)(sn * 2 + -1);
      lVar5 = 1;
      uVar8 = 0;
      do {
        lVar6 = lVar3;
        if ((long)uVar8 < (long)sn) {
          lVar6 = lVar5;
        }
        piVar4 = a + 1;
        if ((uVar8 != 0) && (piVar4 = a + lVar3, (long)uVar8 <= (long)sn)) {
          piVar4 = a + uVar2;
        }
        a[uVar8 * 2] = a[uVar8 * 2] - (a[lVar6] + *piVar4 >> 1);
        uVar8 = uVar8 + 1;
        uVar2 = uVar2 + 2;
        lVar5 = lVar5 + 2;
      } while ((uint)dn != uVar8);
    }
    if (0 < sn) {
      lVar3 = (long)(dn * 2 + -2);
      lVar5 = 2;
      uVar8 = 0;
      do {
        lVar6 = lVar5 + -2;
        if ((long)dn <= (long)uVar8) {
          lVar6 = lVar3;
        }
        uVar1 = uVar8 + 1;
        lVar7 = lVar3;
        if ((long)uVar1 < (long)dn) {
          lVar7 = lVar5;
        }
        a[uVar8 * 2 + 1] = a[uVar8 * 2 + 1] + (a[lVar6] + a[lVar7] + 2 >> 2);
        lVar5 = lVar5 + 2;
        uVar8 = uVar1;
      } while ((uint)sn != uVar1);
    }
  }
  return;
}

Assistant:

static void opj_dwt_encode_1(OPJ_INT32 *a, OPJ_INT32 dn, OPJ_INT32 sn,
                             OPJ_INT32 cas)
{
    OPJ_INT32 i;

    if (!cas) {
        if ((dn > 0) || (sn > 1)) { /* NEW :  CASE ONE ELEMENT */
            for (i = 0; i < dn; i++) {
                OPJ_D(i) -= (OPJ_S_(i) + OPJ_S_(i + 1)) >> 1;
            }
            for (i = 0; i < sn; i++) {
                OPJ_S(i) += (OPJ_D_(i - 1) + OPJ_D_(i) + 2) >> 2;
            }
        }
    } else {
        if (!sn && dn == 1) {       /* NEW :  CASE ONE ELEMENT */
            OPJ_S(0) *= 2;
        } else {
            for (i = 0; i < dn; i++) {
                OPJ_S(i) -= (OPJ_DD_(i) + OPJ_DD_(i - 1)) >> 1;
            }
            for (i = 0; i < sn; i++) {
                OPJ_D(i) += (OPJ_SS_(i) + OPJ_SS_(i + 1) + 2) >> 2;
            }
        }
    }
}